

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactSonameTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactSonameTag> *this,cmGeneratorTarget *target,
          cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  bool bVar1;
  TargetType TVar2;
  _Base_ptr *config;
  cmAlphaNum local_c0;
  undefined1 local_90 [48];
  string local_60;
  string local_40;
  
  bVar1 = cmGeneratorTarget::IsDLLPlatform((cmGeneratorTarget *)this);
  if (bVar1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              ((string *)&local_c0,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"TARGET_SONAME_FILE is not allowed for DLL target platforms.",
               (allocator<char> *)&local_60);
    reportError((cmGeneratorExpressionContext *)target,(string *)&local_c0,(string *)local_90);
  }
  else {
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this);
    if (TVar2 == SHARED_LIBRARY) {
      config = &(target->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      cmGeneratorTarget::GetDirectory
                (&local_60,(cmGeneratorTarget *)this,(string *)config,RuntimeBinaryArtifact);
      local_c0.View_._M_len = local_60._M_string_length;
      local_c0.View_._M_str = local_60._M_dataplus._M_p;
      local_90._8_8_ = local_90 + 0x10;
      local_90._0_8_ = (pointer)0x1;
      local_90[0x10] = '/';
      cmGeneratorTarget::GetSOName(&local_40,(cmGeneratorTarget *)this,(string *)config);
      cmStrCat<std::__cxx11::string>
                (__return_storage_ptr__,&local_c0,(cmAlphaNum *)local_90,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      return __return_storage_ptr__;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              ((string *)&local_c0,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"TARGET_SONAME_FILE is allowed only for SHARED libraries.",
               (allocator<char> *)&local_60);
    reportError((cmGeneratorExpressionContext *)target,(string *)&local_c0,(string *)local_90);
  }
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)&local_c0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context,
                            const GeneratorExpressionContent* content)
  {
    // The target soname file (.so.1).
    if (target->IsDLLPlatform()) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_FILE is not allowed "
                    "for DLL target platforms.");
      return std::string();
    }
    if (target->GetType() != cmStateEnums::SHARED_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_FILE is allowed only for "
                    "SHARED libraries.");
      return std::string();
    }
    std::string result = cmStrCat(target->GetDirectory(context->Config), '/',
                                  target->GetSOName(context->Config));
    return result;
  }